

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_bswap16_i32_mips64el(TCGContext_conflict6 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg)

{
  TCGOp *pTVar1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_bswap16_i32);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_bswap16_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg)
{
    if (TCG_TARGET_HAS_bswap16_i32) {
        tcg_gen_op2_i32(tcg_ctx, INDEX_op_bswap16_i32, ret, arg);
    } else {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_ext8u_i32(tcg_ctx, t0, arg);
        tcg_gen_shli_i32(tcg_ctx, t0, t0, 8);
        tcg_gen_shri_i32(tcg_ctx, ret, arg, 8);
        tcg_gen_or_i32(tcg_ctx, ret, ret, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}